

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

value * mjs::to_primitive(value *__return_storage_ptr__,value *v,value_type hint)

{
  long *plVar1;
  undefined8 *puVar2;
  uint uVar3;
  char cVar4;
  bool bVar5;
  object_ptr o;
  value fo;
  gc_heap_ptr_untyped local_88;
  vector<mjs::value,_std::allocator<mjs::value>_> local_78;
  value *local_60;
  value local_58;
  
  if (v->type_ == object) {
    local_88.heap_ =
         (v->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_;
    local_88.pos_ = *(uint32_t *)((long)&v->field_1 + 8);
    if (local_88.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_88.heap_,&local_88);
    }
    if (hint == undefined) {
      plVar1 = (long *)gc_heap_ptr_untyped::get(&local_88);
      hint = (**(code **)(*plVar1 + 0x18))(plVar1);
    }
    local_60 = v;
    if (1 < hint - number) {
      __assert_fail("hint == value_type::number || hint == value_type::string",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.cpp"
                    ,0x7c,"value mjs::to_primitive(const value &, value_type)");
    }
    uVar3 = 0;
    while( true ) {
      puVar2 = (undefined8 *)gc_heap_ptr_untyped::get(&local_88);
      bVar5 = (hint == string) != uVar3;
      local_78.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x19c69c;
      if (!bVar5) {
        local_78.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x19e1fc;
      }
      local_78.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)((ulong)bVar5 + 7);
      (**(code **)*puVar2)(&local_58,puVar2,&local_78);
      cVar4 = '\x04';
      if (local_58.type_ == object) {
        local_78.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_78.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_78.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        call_function(__return_storage_ptr__,&local_58,local_60,&local_78);
        std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&local_78);
        bVar5 = string < __return_storage_ptr__->type_;
        cVar4 = bVar5 * '\x03' + '\x01';
        if (bVar5) {
          value::destroy(__return_storage_ptr__);
        }
      }
      value::destroy(&local_58);
      if (cVar4 != '\x04') break;
      uVar3 = uVar3 + 1;
      if (uVar3 != 1) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar2 = &PTR__exception_001d3608;
        __cxa_throw(puVar2,&to_primitive_failed_error::typeinfo,std::exception::~exception);
      }
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_88);
  }
  else {
    __return_storage_ptr__->type_ = undefined;
    value::operator=(__return_storage_ptr__,v);
  }
  return __return_storage_ptr__;
}

Assistant:

value to_primitive(const value& v, value_type hint) {
    if (v.type() != value_type::object) {
        return v;
    }

    auto o = v.object_value();

    // [[DefaultValue]] (Hint)
    if (hint == value_type::undefined) {
        // When hint is undefined, assume Number unless it's a Date object in which case assume String
        hint = o->default_value_type();
    }

    assert(hint == value_type::number || hint == value_type::string);
    for (int i = 0; i < 2; ++i) {
        const wchar_t* const id = (hint == value_type::string) ^ i ? L"toString" : L"valueOf";
        const auto fo = o->get(id);
        if (fo.type() != value_type::object) {
            continue;
        }
        auto res = call_function(fo, v, {});
        if (!is_primitive(res.type())) {
            continue;
        }
        return res;
    }

    throw to_primitive_failed_error{};
}